

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DCFGReader.cpp
# Opt level: O3

Addr str2addr(string *str)

{
  char *__nptr;
  int iVar1;
  int *piVar2;
  ulong uVar3;
  char *local_50;
  char *local_48 [2];
  char local_38 [16];
  
  iVar1 = std::__cxx11::string::compare((ulong)str,0,(char *)0x2);
  if (iVar1 != 0) {
    __assert_fail("str.compare(0, 2, \"0x\") == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                  ,0xb4,"Addr str2addr(const std::string &)");
  }
  std::__cxx11::string::substr((ulong)local_48,(ulong)str);
  __nptr = local_48[0];
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  uVar3 = strtoul(__nptr,&local_50,0x10);
  if (local_50 == __nptr) {
    std::__throw_invalid_argument("stoul");
    goto LAB_0010ec18;
  }
  if (*piVar2 == 0) {
LAB_0010ebc3:
    *piVar2 = iVar1;
  }
  else if (*piVar2 == 0x22) {
    std::__throw_out_of_range("stoul");
    goto LAB_0010ebc3;
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  if (uVar3 != 0) {
    return uVar3;
  }
LAB_0010ec18:
  __assert_fail("addr != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                ,0xb6,"Addr str2addr(const std::string &)");
}

Assistant:

static
Addr str2addr(const std::string& str) {
	assert(str.compare(0, 2, "0x") == 0);
	Addr addr = std::stoul(str.substr(2), 0, 16);
	assert(addr != 0);

	return addr;
}